

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_helpers.cc
# Opt level: O2

bool google::protobuf::compiler::java::HasRequiredFields
               (Descriptor *type,
               unordered_set<const_google::protobuf::Descriptor_*,_std::hash<const_google::protobuf::Descriptor_*>,_std::equal_to<const_google::protobuf::Descriptor_*>,_std::allocator<const_google::protobuf::Descriptor_*>_>
               *already_seen)

{
  bool bVar1;
  JavaType JVar2;
  size_type sVar3;
  Descriptor *type_00;
  bool bVar4;
  int i;
  long lVar5;
  FieldDescriptor *field;
  long lVar6;
  Descriptor *local_30;
  
  local_30 = type;
  sVar3 = std::
          _Hashtable<const_google::protobuf::Descriptor_*,_const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>,_std::__detail::_Identity,_std::equal_to<const_google::protobuf::Descriptor_*>,_std::hash<const_google::protobuf::Descriptor_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::count(&already_seen->_M_h,&local_30);
  if (sVar3 == 0) {
    std::__detail::
    _Insert_base<const_google::protobuf::Descriptor_*,_const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>,_std::__detail::_Identity,_std::equal_to<const_google::protobuf::Descriptor_*>,_std::hash<const_google::protobuf::Descriptor_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::insert((_Insert_base<const_google::protobuf::Descriptor_*,_const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>,_std::__detail::_Identity,_std::equal_to<const_google::protobuf::Descriptor_*>,_std::hash<const_google::protobuf::Descriptor_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              *)already_seen,&local_30);
    bVar4 = true;
    if (*(int *)(local_30 + 0x78) < 1) {
      lVar5 = 0;
      for (lVar6 = 0;
          (bVar4 = lVar5 < *(int *)(local_30 + 4), lVar5 < *(int *)(local_30 + 4) &&
          ((*(byte *)(*(long *)(local_30 + 0x28) + 1 + lVar6) & 0x60) != 0x40));
          lVar6 = lVar6 + 0x48) {
        field = (FieldDescriptor *)(*(long *)(local_30 + 0x28) + lVar6);
        JVar2 = GetJavaType(field);
        if (JVar2 == JAVATYPE_MESSAGE) {
          type_00 = FieldDescriptor::message_type(field);
          bVar1 = HasRequiredFields(type_00,already_seen);
          if (bVar1) {
            return bVar4;
          }
        }
        lVar5 = lVar5 + 1;
      }
    }
  }
  else {
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool HasRequiredFields(const Descriptor* type,
                       std::unordered_set<const Descriptor*>* already_seen) {
  if (already_seen->count(type) > 0) {
    // The type is already in cache.  This means that either:
    // a. The type has no required fields.
    // b. We are in the midst of checking if the type has required fields,
    //    somewhere up the stack.  In this case, we know that if the type
    //    has any required fields, they'll be found when we return to it,
    //    and the whole call to HasRequiredFields() will return true.
    //    Therefore, we don't have to check if this type has required fields
    //    here.
    return false;
  }
  already_seen->insert(type);

  // If the type has extensions, an extension with message type could contain
  // required fields, so we have to be conservative and assume such an
  // extension exists.
  if (type->extension_range_count() > 0) return true;

  for (int i = 0; i < type->field_count(); i++) {
    const FieldDescriptor* field = type->field(i);
    if (field->is_required()) {
      return true;
    }
    if (GetJavaType(field) == JAVATYPE_MESSAGE) {
      if (HasRequiredFields(field->message_type(), already_seen)) {
        return true;
      }
    }
  }

  return false;
}